

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void run_field_be32_overflow(void)

{
  int iVar1;
  secp256k1_fe fe_ff;
  secp256k1_fe fe_2;
  uchar out_2 [32];
  secp256k1_fe fe_1;
  uchar out_1 [32];
  secp256k1_fe fe;
  uchar out [32];
  uchar *in_stack_fffffffffffffee8;
  secp256k1_fe *in_stack_fffffffffffffef0;
  secp256k1_fe local_f0;
  uchar local_c8 [40];
  secp256k1_fe local_a0;
  uchar local_78 [40];
  secp256k1_fe local_50;
  uchar local_28 [40];
  
  iVar1 = secp256k1_fe_impl_set_b32_limit(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc03,"test condition failed: secp256k1_fe_set_b32_limit(&fe, zero_overflow) == 0");
    abort();
  }
  secp256k1_fe_impl_set_b32_mod(&local_50,run_field_be32_overflow::zero_overflow);
  iVar1 = secp256k1_fe_impl_normalizes_to_zero(&local_50);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc05,"test condition failed: secp256k1_fe_normalizes_to_zero(&fe) == 1");
    abort();
  }
  secp256k1_fe_impl_normalize(&local_50);
  iVar1 = secp256k1_fe_impl_is_zero(&local_50);
  if (iVar1 != 1) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc07,"test condition failed: secp256k1_fe_is_zero(&fe) == 1");
    abort();
  }
  secp256k1_fe_impl_get_b32(local_28,&local_50);
  iVar1 = secp256k1_memcmp_var(local_28,"",0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc09,"test condition failed: secp256k1_memcmp_var(out, zero, 32) == 0");
    abort();
  }
  iVar1 = secp256k1_fe_impl_set_b32_limit(in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc1a,"test condition failed: secp256k1_fe_set_b32_limit(&fe, one_overflow) == 0");
    abort();
  }
  secp256k1_fe_impl_set_b32_mod(&local_a0,run_field_be32_overflow::one_overflow);
  secp256k1_fe_impl_normalize(&local_a0);
  iVar1 = secp256k1_fe_impl_cmp_var(&local_a0,&secp256k1_fe_one);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc1d,"test condition failed: secp256k1_fe_cmp_var(&fe, &secp256k1_fe_one) == 0");
    abort();
  }
  secp256k1_fe_impl_get_b32(local_78,&local_a0);
  iVar1 = secp256k1_memcmp_var(local_78,"",0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc1f,"test condition failed: secp256k1_memcmp_var(out, one, 32) == 0");
    abort();
  }
  memset(&stack0xfffffffffffffee8,0,0x28);
  iVar1 = secp256k1_fe_impl_set_b32_limit(in_stack_fffffffffffffef0,(uchar *)0x1000003d0);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc31,"test condition failed: secp256k1_fe_set_b32_limit(&fe, ff_overflow) == 0");
    abort();
  }
  secp256k1_fe_impl_set_b32_mod(&local_f0,run_field_be32_overflow::ff_overflow);
  secp256k1_fe_impl_normalize(&local_f0);
  iVar1 = secp256k1_fe_impl_cmp_var(&local_f0,(secp256k1_fe *)&stack0xfffffffffffffee8);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc34,"test condition failed: secp256k1_fe_cmp_var(&fe, &fe_ff) == 0");
    abort();
  }
  secp256k1_fe_impl_get_b32(local_c8,&local_f0);
  iVar1 = secp256k1_memcmp_var(local_c8,"",0x20);
  if (iVar1 != 0) {
    fprintf(_stderr,"%s:%d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/jonasnick[P]secp256k1-zkp/src/tests.c"
            ,0xc36,"test condition failed: secp256k1_memcmp_var(out, ff, 32) == 0");
    abort();
  }
  return;
}

Assistant:

static void run_field_be32_overflow(void) {
    {
        static const unsigned char zero_overflow[32] = {
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFE, 0xFF, 0xFF, 0xFC, 0x2F,
        };
        static const unsigned char zero[32] = { 0x00 };
        unsigned char out[32];
        secp256k1_fe fe;
        CHECK(secp256k1_fe_set_b32_limit(&fe, zero_overflow) == 0);
        secp256k1_fe_set_b32_mod(&fe, zero_overflow);
        CHECK(secp256k1_fe_normalizes_to_zero(&fe) == 1);
        secp256k1_fe_normalize(&fe);
        CHECK(secp256k1_fe_is_zero(&fe) == 1);
        secp256k1_fe_get_b32(out, &fe);
        CHECK(secp256k1_memcmp_var(out, zero, 32) == 0);
    }
    {
        static const unsigned char one_overflow[32] = {
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFE, 0xFF, 0xFF, 0xFC, 0x30,
        };
        static const unsigned char one[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x01,
        };
        unsigned char out[32];
        secp256k1_fe fe;
        CHECK(secp256k1_fe_set_b32_limit(&fe, one_overflow) == 0);
        secp256k1_fe_set_b32_mod(&fe, one_overflow);
        secp256k1_fe_normalize(&fe);
        CHECK(secp256k1_fe_cmp_var(&fe, &secp256k1_fe_one) == 0);
        secp256k1_fe_get_b32(out, &fe);
        CHECK(secp256k1_memcmp_var(out, one, 32) == 0);
    }
    {
        static const unsigned char ff_overflow[32] = {
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
            0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF, 0xFF,
        };
        static const unsigned char ff[32] = {
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00, 0x00,
            0x00, 0x00, 0x00, 0x01, 0x00, 0x00, 0x03, 0xD0,
        };
        unsigned char out[32];
        secp256k1_fe fe;
        const secp256k1_fe fe_ff = SECP256K1_FE_CONST(0, 0, 0, 0, 0, 0, 0x01, 0x000003d0);
        CHECK(secp256k1_fe_set_b32_limit(&fe, ff_overflow) == 0);
        secp256k1_fe_set_b32_mod(&fe, ff_overflow);
        secp256k1_fe_normalize(&fe);
        CHECK(secp256k1_fe_cmp_var(&fe, &fe_ff) == 0);
        secp256k1_fe_get_b32(out, &fe);
        CHECK(secp256k1_memcmp_var(out, ff, 32) == 0);
    }
}